

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockaddr.c
# Opt level: O0

uint32_t nng_sockaddr_port(nng_sockaddr *sa)

{
  uint16_t port16;
  nng_sockaddr *sa_local;
  
  if (sa->s_family == 3) {
    sa_local._4_4_ =
         (uint)(ushort)((ushort)(byte)(sa->s_ipc).sa_path[0] * 0x100 +
                       (ushort)(byte)(sa->s_ipc).sa_path[1]);
  }
  else if (sa->s_family == 4) {
    sa_local._4_4_ =
         (uint)(ushort)((ushort)(byte)(sa->s_ipc).sa_path[0] * 0x100 +
                       (ushort)(byte)(sa->s_ipc).sa_path[1]);
  }
  else {
    sa_local._4_4_ = 0;
  }
  return sa_local._4_4_;
}

Assistant:

uint32_t
nng_sockaddr_port(const nng_sockaddr *sa)
{
	uint16_t port16;
	switch (sa->s_family) {
	case NNG_AF_INET:
		NNI_GET16(&sa->s_in.sa_port, port16);
		return (port16);
	case NNG_AF_INET6:
		NNI_GET16(&sa->s_in6.sa_port, port16);
		return (port16);
	default:
		return (0);
	}
}